

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  OfType OVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  size_t sVar14;
  size_t sVar15;
  size_type sVar16;
  int iVar17;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar18;
  size_t sVar19;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  char *local_98;
  ReusableStringStream local_90;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char *local_48;
  size_t local_40;
  OfType local_38;
  uint local_34;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00186dc0;
  uVar6 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_start + 4);
  sVar4 = (_assertionResult->m_info).macroName.m_size;
  uVar7 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_size + 4);
  uVar8 = *(undefined4 *)&(_assertionResult->m_info).lineInfo.file;
  uVar9 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.file + 4);
  sVar5 = (_assertionResult->m_info).lineInfo.line;
  uVar10 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.line + 4);
  uVar11 = *(undefined4 *)&(_assertionResult->m_info).capturedExpression.m_start;
  uVar12 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_start + 4);
  sVar16 = (_assertionResult->m_info).capturedExpression.m_size;
  uVar13 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start =
       *(undefined4 *)&(_assertionResult->m_info).macroName.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar6;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar4;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar7;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar8;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar9;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar5;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar10;
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start = uVar11;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar12;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar16;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar13;
  uVar6 = *(undefined4 *)&(_assertionResult->m_info).field_0x34;
  (this->assertionResult).m_info.resultDisposition = (_assertionResult->m_info).resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar6;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar2 = (_assertionResult->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar2 = (_assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar2,
             pcVar2 + (_assertionResult->m_resultData).reconstructedExpression._M_string_length);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (ITransientExpression *)0x0;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated =
       (_assertionResult->m_resultData).lazyExpression.m_isNegated;
  (this->assertionResult).m_resultData.resultType = (_assertionResult->m_resultData).resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar17 = _totals->error;
  uVar6 = *(undefined4 *)&_totals->field_0x4;
  sVar5 = (_totals->assertions).passed;
  sVar19 = (_totals->assertions).failed;
  sVar14 = (_totals->assertions).failedButOk;
  sVar15 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar15;
  (this->totals).assertions.failed = sVar19;
  (this->totals).assertions.failedButOk = sVar14;
  (this->totals).error = iVar17;
  *(undefined4 *)&(this->totals).field_0x4 = uVar6;
  (this->totals).assertions.passed = sVar5;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    pcVar3 = (this->assertionResult).m_info.macroName.m_start;
    sVar4 = (this->assertionResult).m_info.macroName.m_size;
    local_98 = (this->assertionResult).m_info.lineInfo.file;
    sVar5 = (this->assertionResult).m_info.lineInfo.line;
    OVar1 = (this->assertionResult).m_resultData.resultType;
    local_90.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00187348
    ;
    pSVar18 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    sVar19 = StringStreams::add(&pSVar18->super_StringStreams);
    local_90.m_index = sVar19;
    pSVar18 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    local_90.m_oss =
         *(ostream **)
          &(pSVar18->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar19]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_48 = local_98;
    MessageInfo::globalCount = MessageInfo::globalCount + 1;
    pcVar2 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b8 = local_a8;
    local_78._0_8_ = pcVar3;
    local_78._8_8_ = sVar4;
    local_68._M_p = (pointer)&local_58;
    local_40 = sVar5;
    local_38 = OVar1;
    local_34 = MessageInfo::globalCount;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar2,
               pcVar2 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_90.m_oss,(char *)local_b8,local_b0);
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_b8);
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,
                      CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
    }
    ReusableStringStream::~ReusableStringStream(&local_90);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }